

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::_::
CopyConstructArray_<capnp::_::RpcSystemBase::RpcConnectionState::Export,_capnp::_::RpcSystemBase::RpcConnectionState::Export_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 node;
  ClientHook *pCVar1;
  Disposer *pDVar2;
  Export *pEVar3;
  
  pEVar3 = this->pos;
  if (this->start < pEVar3) {
    do {
      this->pos = pEVar3 + -1;
      if (pEVar3[-1].vineInfo.ptr.ptr != (VineInfo *)0x0) {
        pEVar3[-1].vineInfo.ptr.ptr = (VineInfo *)0x0;
        (**(pEVar3[-1].vineInfo.ptr.disposer)->_vptr_Disposer)();
      }
      if ((pEVar3[-1].resolveOp.ptr.isSet == true) &&
         (node = pEVar3[-1].resolveOp.ptr.field_1,
         node != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
        pEVar3[-1].resolveOp.ptr.field_1 =
             (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
        PromiseDisposer::dispose((PromiseArenaMember *)node);
      }
      pCVar1 = pEVar3[-1].clientHook.ptr;
      if (pCVar1 != (ClientHook *)0x0) {
        pEVar3[-1].clientHook.ptr = (ClientHook *)0x0;
        pDVar2 = pEVar3[-1].clientHook.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(_func_int *)
                          ((long)&pCVar1->_vptr_ClientHook + (long)pCVar1->_vptr_ClientHook[-2]));
      }
      pEVar3 = this->pos;
    } while (this->start < pEVar3);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }